

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

string * helics::fedStateString_abi_cxx11_(FederateStates state)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if (fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                 created_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_,
                 "created",&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::created_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::
                                 estate_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_,
                 "error",&local_12);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::estate_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_,
                 "initializing",&local_13);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::init_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_,
                 "disconnected",&local_14);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::dis_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_,
                 "executing",&local_15);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::exec_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_,
                 "terminating",&local_16);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::term_abi_cxx11_);
    }
  }
  if (fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_,
                 "unknown",&local_17);
      __cxa_atexit(std::__cxx11::string::~string,
                   &fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_);
    }
  }
  if (state < UNKNOWN) {
    psVar2 = (string *)(&PTR_created_abi_cxx11__00456cc0)[state];
  }
  else {
    psVar2 = &fedStateString[abi:cxx11](helics::FederateStates)::unk_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

const std::string& fedStateString(FederateStates state)
{
    static const std::string created{"created"};
    static const std::string estate{"error"};
    static const std::string init{"initializing"};
    static const std::string dis{"disconnected"};
    static const std::string exec{"executing"};
    static const std::string term{"terminating"};
    static const std::string unk{"unknown"};

    switch (state) {
        case FederateStates::CREATED:
            return created;
        case FederateStates::INITIALIZING:
            return init;
        case FederateStates::EXECUTING:
            return exec;
        case FederateStates::TERMINATING:
            return term;
        case FederateStates::FINISHED:
            return dis;
        case FederateStates::ERRORED:
            return estate;
        case FederateStates::UNKNOWN:
        default:
            return unk;
    }
}